

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

int simple_motion_search_get_best_ref
              (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int mi_row,int mi_col,
              BLOCK_SIZE bsize,int *refs,int num_refs,int use_subpixel,int save_mv,uint *best_sse,
              uint *best_var)

{
  int iVar1;
  int iVar2;
  int_mv iVar3;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000020;
  SIMPLE_MOTION_DATA_TREE *sub_tree;
  int r_idx;
  int_mv best_mv;
  uint curr_var;
  uint curr_sse;
  FULLPEL_MV *start_mvs;
  int ref;
  int ref_idx;
  int num_planes;
  int best_ref;
  AV1_COMMON *cm;
  int in_stack_000001e8;
  BLOCK_SIZE in_stack_000001ef;
  int in_stack_000001f0;
  int in_stack_000001f4;
  MACROBLOCK *in_stack_000001f8;
  AV1_COMP *in_stack_00000200;
  FULLPEL_MV in_stack_00000220;
  int in_stack_00000228;
  int in_stack_00000230;
  uint *in_stack_00000238;
  uint *in_stack_00000240;
  int local_68;
  short local_64;
  short sStack_62;
  int local_4c;
  int local_44;
  int local_c;
  
  local_44 = -1;
  if ((in_R8D < *(int *)(in_RDI + 0x3c198)) && (in_ECX < *(int *)(in_RDI + 0x3c194))) {
    sub_tree->block_size = BLOCK_INVALID;
    sub_tree->partitioning = 0xff;
    *(undefined2 *)&sub_tree->field_0x2 = 0x7fff;
    for (local_4c = 0; local_4c < in_stack_00000010; local_4c = local_4c + 1) {
      iVar2 = *(int *)(in_stack_00000008 + (long)local_4c * 4);
      if ((*(uint *)(in_RDI + 0x608b8) & (uint)""[iVar2]) != 0) {
        iVar3 = av1_simple_motion_search_sse_var
                          (in_stack_00000200,in_stack_000001f8,in_stack_000001f4,in_stack_000001f0,
                           in_stack_000001ef,in_stack_000001e8,in_stack_00000220,in_stack_00000228,
                           in_stack_00000230,in_stack_00000238,in_stack_00000240);
        iVar1._0_1_ = sub_tree->block_size;
        iVar1._1_1_ = sub_tree->partitioning;
        iVar1._2_2_ = *(undefined2 *)&sub_tree->field_0x2;
        if (iVar1 != 0) {
          sub_tree->block_size = BLOCK_4X4;
          sub_tree->partitioning = '\0';
          *(undefined2 *)&sub_tree->field_0x2 = 0;
          *_r_idx = 0;
          local_44 = iVar2;
        }
        if (in_stack_00000020 != 0) {
          local_64 = iVar3.as_mv.row;
          *(short *)(in_RDX + 0x28 + (long)iVar2 * 4) = (short)((long)(int)local_64 / 8);
          sStack_62 = iVar3.as_mv.col;
          *(short *)(in_RDX + 0x2a + (long)iVar2 * 4) = (short)((long)(int)sStack_62 / 8);
          if (2 < in_R9B) {
            for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
              *(undefined4 *)(*(long *)(in_RDX + 8 + (long)local_68 * 8) + 0x28 + (long)iVar2 * 4) =
                   *(undefined4 *)(in_RDX + 0x28 + (long)iVar2 * 4);
            }
          }
        }
      }
    }
    local_c = local_44;
  }
  else {
    *_r_idx = 0;
    sub_tree->block_size = BLOCK_4X4;
    sub_tree->partitioning = '\0';
    *(undefined2 *)&sub_tree->field_0x2 = 0;
    local_c = -1;
  }
  return local_c;
}

Assistant:

static int simple_motion_search_get_best_ref(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    int mi_row, int mi_col, BLOCK_SIZE bsize, const int *const refs,
    int num_refs, int use_subpixel, int save_mv, unsigned int *best_sse,
    unsigned int *best_var) {
  const AV1_COMMON *const cm = &cpi->common;
  int best_ref = -1;

  if (mi_col >= cm->mi_params.mi_cols || mi_row >= cm->mi_params.mi_rows) {
    // If the whole block is outside of the image, set the var and sse to 0.
    *best_var = 0;
    *best_sse = 0;

    return best_ref;
  }

  // Otherwise do loop through the reference frames and find the one with the
  // minimum SSE
  const int num_planes = 1;

  *best_sse = INT_MAX;

  for (int ref_idx = 0; ref_idx < num_refs; ref_idx++) {
    const int ref = refs[ref_idx];

    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref]) {
      const FULLPEL_MV *start_mvs = sms_tree->start_mvs;
      unsigned int curr_sse = 0, curr_var = 0;
      const int_mv best_mv = av1_simple_motion_search_sse_var(
          cpi, x, mi_row, mi_col, bsize, ref, start_mvs[ref], num_planes,
          use_subpixel, &curr_sse, &curr_var);
      if (curr_sse < *best_sse) {
        *best_sse = curr_sse;
        *best_var = curr_var;
        best_ref = ref;
      }

      if (save_mv) {
        sms_tree->start_mvs[ref].row = best_mv.as_mv.row / 8;
        sms_tree->start_mvs[ref].col = best_mv.as_mv.col / 8;

        if (bsize >= BLOCK_8X8) {
          for (int r_idx = 0; r_idx < SUB_PARTITIONS_SPLIT; r_idx++) {
            // Propagate the new motion vectors to a lower level
            SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[r_idx];
            sub_tree->start_mvs[ref] = sms_tree->start_mvs[ref];
          }
        }
      }
    }
  }

  return best_ref;
}